

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadVertexes(MapData *map)

{
  double *pdVar1;
  FileReader *pFVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  vertex_t *pvVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  SWORD y;
  SWORD x;
  MapData *local_38;
  
  pFVar2 = map->MapLumps[4].Reader;
  if (pFVar2 == (FileReader *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)(uint)pFVar2->Length;
  }
  numvertexes = (int)(uVar5 >> 2);
  numvertexdatas = 0;
  local_38 = map;
  if ((uint)uVar5 < 4) {
    I_Error("Map has no vertices.\n");
  }
  iVar4 = numvertexes;
  uVar9 = (ulong)numvertexes;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar9;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x38),8) == 0) {
    uVar5 = SUB168(auVar3 * ZEXT816(0x38),0);
  }
  vertexes = (vertex_t *)operator_new__(uVar5);
  if (iVar4 != 0) {
    pvVar6 = vertexes;
    do {
      (pvVar6->p).X = 0.0;
      (pvVar6->p).Y = 0.0;
      pvVar6->viewangle = 0;
      pvVar6->angletime = 0;
      pvVar6->dirty = true;
      pvVar6->numheights = 0;
      pvVar6->numsectors = 0;
      pvVar6->sectors = (sector_t **)0x0;
      pvVar6->heightlist = (float *)0x0;
      pvVar6 = pvVar6 + 1;
    } while (pvVar6 != vertexes + uVar9);
  }
  vertexdatas = (vertexdata_t *)0x0;
  pFVar2 = local_38->MapLumps[4].Reader;
  local_38->file = pFVar2;
  lVar8 = 0;
  (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar2,0,0);
  for (lVar7 = 0; lVar7 < numvertexes; lVar7 = lVar7 + 1) {
    pFVar2 = local_38->file;
    (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,&x,2);
    (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,&y,2);
    pdVar1 = (double *)((long)&(vertexes->p).X + lVar8);
    *pdVar1 = (double)(int)x;
    pdVar1[1] = (double)(int)((long)((ulong)(ushort)y << 0x30) >> 0x30);
    lVar8 = lVar8 + 0x38;
  }
  return;
}

Assistant:

void P_LoadVertexes (MapData * map)
{
	int i;

	// Determine number of vertices:
	//	total lump length / vertex record length.
	numvertexes = map->Size(ML_VERTEXES) / sizeof(mapvertex_t);
	numvertexdatas = 0;

	if (numvertexes == 0)
	{
		I_Error ("Map has no vertices.\n");
	}

	// Allocate memory for buffer.
	vertexes = new vertex_t[numvertexes];		
	vertexdatas = NULL;

	map->Seek(ML_VERTEXES);
		
	// Copy and convert vertex coordinates, internal representation as fixed.
	for (i = 0; i < numvertexes; i++)
	{
		SWORD x, y;

		(*map->file) >> x >> y;
		vertexes[i].set(double(x), double(y));
	}
}